

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QTzTransitionRule>::reallocate
          (QPodArrayOps<QTzTransitionRule> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QTzTransitionRule>_*,_QTzTransitionRule_*> pVar1;
  
  pVar1 = QTypedArrayData<QTzTransitionRule>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<QTzTransitionRule>).d,
                     (this->super_QArrayDataPointer<QTzTransitionRule>).ptr,alloc,option);
  if (pVar1.second != (QTzTransitionRule *)0x0) {
    (this->super_QArrayDataPointer<QTzTransitionRule>).d = pVar1.first;
    (this->super_QArrayDataPointer<QTzTransitionRule>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }